

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

uint32_t llama_sampler_get_seed(llama_sampler *smpl)

{
  undefined8 *puVar1;
  llama_sampler_i *plVar2;
  long lVar3;
  uint32_t uVar4;
  __normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
  __tmp;
  long lVar5;
  
  plVar2 = smpl->iface;
  if (plVar2 != &llama_sampler_dist_i) {
    if (plVar2 == &llama_sampler_mirostat_i) {
      return *(uint32_t *)((long)smpl->ctx + 8);
    }
    if (plVar2 != &llama_sampler_mirostat_v2_i) {
      if (plVar2 != &llama_sampler_chain_i) {
        return 0xffffffff;
      }
      lVar3 = *(long *)((long)smpl->ctx + 8);
      lVar5 = *(long *)((long)smpl->ctx + 0x10);
      do {
        if (lVar5 == lVar3) {
          return 0xffffffff;
        }
        puVar1 = (undefined8 *)(lVar5 + -8);
        lVar5 = lVar5 + -8;
        uVar4 = llama_sampler_get_seed((llama_sampler *)*puVar1);
      } while (uVar4 == 0xffffffff);
      return uVar4;
    }
  }
  return *(uint32_t *)((long)smpl->ctx + 4);
}

Assistant:

uint32_t llama_sampler_get_seed(const struct llama_sampler * smpl) {
    if (smpl->iface == &llama_sampler_dist_i) {
        return ((const llama_sampler_dist *) smpl->ctx)->seed_cur;
    }

    if (smpl->iface == &llama_sampler_mirostat_i) {
        return ((const llama_sampler_mirostat *) smpl->ctx)->seed_cur;
    }

    if (smpl->iface == &llama_sampler_mirostat_v2_i) {
        return ((const llama_sampler_mirostat_v2 *) smpl->ctx)->seed_cur;
    }

    if (smpl->iface == &llama_sampler_chain_i) {
        const auto * ctx = (const llama_sampler_chain *) smpl->ctx;
        for (auto it = ctx->samplers.rbegin(); it != ctx->samplers.rend(); ++it) {
            const uint32_t seed = llama_sampler_get_seed(*it);
            if (seed != LLAMA_DEFAULT_SEED) {
                return seed;
            }
        }
    }

    return LLAMA_DEFAULT_SEED;
}